

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O0

string * SighashToStr_abi_cxx11_(uchar sighash_type)

{
  bool bVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  const_iterator *it;
  _Rb_tree_const_iterator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff88;
  map<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff90;
  _Self *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  const_iterator local_18;
  undefined8 local_8;
  
  local_8 = *(size_type *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  local_18 = std::
             map<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(in_stack_ffffffffffffff90,(key_type_conflict6 *)in_stack_ffffffffffffff88);
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffe8;
  std::
  map<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::end(in_stack_ffffffffffffff90);
  bVar1 = std::operator==(in_stack_ffffffffffffff98,(_Self *)in_stack_ffffffffffffff90);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd8,(char *)this,(allocator<char> *)__str);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdf);
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(in_stack_ffffffffffffff88);
    std::__cxx11::string::string(this,__str);
  }
  if (*(size_type *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string SighashToStr(unsigned char sighash_type)
{
    const auto& it = mapSigHashTypes.find(sighash_type);
    if (it == mapSigHashTypes.end()) return "";
    return it->second;
}